

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.cpp
# Opt level: O2

void __thiscall
arbiter::drivers::AZ::AZ
          (AZ *this,Pool *pool,string *profile,
          unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
          *config)

{
  bool bVar1;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,"az",&local_89);
  ::std::__cxx11::string::string((string *)&local_68,"http",&local_8a);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            profile,"default");
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_88,"",&local_8b);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_88,(string *)profile);
  }
  Http::Http(&this->super_Http,pool,&local_48,&local_68,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_Http).super_Driver._vptr_Driver = (_func_int **)&PTR__AZ_0019ba58;
  (this->m_config)._M_t.
  super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
  .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl =
       (config->_M_t).
       super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
       ._M_t.
       super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
       .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl;
  (config->_M_t).
  super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
  .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl = (Config *)0x0;
  return;
}

Assistant:

AZ::AZ(
        Pool& pool,
        std::string profile,
        std::unique_ptr<Config> config)
    : Http(pool, "az", "http", profile == "default" ? "" : profile)
    , m_config(std::move(config))
{ }